

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Wrap.c
# Opt level: O2

int XUtf8UcsWidth(XUtf8FontStruct *font_set,uint ucs)

{
  int enc;
  int *piVar1;
  int *piVar2;
  XFontStruct **ppXVar3;
  unsigned_short uVar4;
  int iVar5;
  int iVar6;
  uint ucs_00;
  long lVar7;
  long lVar8;
  long lVar9;
  char glyph [2];
  XChar2b buf [8];
  
  iVar6 = font_set->nb_font;
  lVar8 = (long)iVar6;
  if (lVar8 < 1) {
    return 0;
  }
  piVar1 = font_set->ranges;
  piVar2 = font_set->encodings;
  ppXVar3 = font_set->fonts;
  lVar9 = 0;
  while( true ) {
    if (lVar8 == lVar9) {
      return 0;
    }
    if (ppXVar3[lVar9] != (XFontStruct *)0x0) break;
    lVar9 = lVar9 + 1;
  }
  uVar4 = XUtf8IsNonSpacing(ucs);
  lVar7 = lVar9;
  ucs_00 = (uint)uVar4;
  if (uVar4 == 0) {
    ucs_00 = ucs;
  }
  do {
    if (lVar8 == lVar7) {
LAB_001f63d6:
      ucs2fontmap(glyph,0x3f,piVar2[lVar9]);
      lVar7 = lVar9;
LAB_001f63ef:
      buf[0].byte1 = glyph[0];
      buf[0].byte2 = glyph[1];
      iVar6 = XTextWidth16(ppXVar3[(int)lVar7],buf,1);
      return iVar6;
    }
    if (ppXVar3[lVar7] != (XFontStruct *)0x0) {
      enc = piVar2[lVar7];
      iVar5 = ucs2fontmap(glyph,ucs_00,enc);
      if ((-1 < iVar5) &&
         ((enc != 0 ||
          ((piVar1[lVar7 * 2] <= (int)ucs_00 && ((int)ucs_00 <= piVar1[lVar7 * 2 + 1])))))) {
        if (iVar6 != (int)lVar7) goto LAB_001f63ef;
        goto LAB_001f63d6;
      }
    }
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

int
XUtf8UcsWidth(XUtf8FontStruct  *font_set,
	      unsigned int     ucs) {

  int		x;
  int 		*encodings; /* encodings array */
  XFontStruct 	**fonts;    /* fonts array */
  Fl_XChar2b 	buf[8];     /* drawing buffer */
  int 		fnum;       /* index of the current font in the fonts array*/
  int 		first;      /* first valid font index */
  int 		nb_font;    /* quantity of fonts in the font array */
  char 		glyph[2];   /* byte1 and byte2 value of the UTF-8 char */
  int		*ranges;    /* sub range of iso10646 */
  unsigned int  no_spc;

  nb_font = font_set->nb_font;
  x = 0;

  if (nb_font < 1) {
    /* there is no font in the font_set :-( */
    return x;
  }

  ranges = font_set->ranges;
  fonts = font_set->fonts;
  encodings = font_set->encodings;
  fnum = 0;

  while(fnum < nb_font && !fonts[fnum]) fnum++;
  if (fnum >= nb_font) {
    /* there is no valid font for the X server */
    return x;
  }

  first = fnum;

  no_spc = XUtf8IsNonSpacing(ucs);
  if (no_spc) ucs = no_spc;

  /*
   * find the first encoding which can be used to
   * draw the glyph
   */
  fnum = first;
  while (fnum < nb_font) {
    if (fonts[fnum] &&
	ucs2fontmap(glyph, ucs, encodings[fnum]) >= 0) {
      if (encodings[fnum] != 0 || ((int)ucs >= ranges[fnum * 2] &&
	  (int)ucs <= ranges[fnum * 2 + 1])) {
	break;
      }
    }
    fnum++;
  }
  if (fnum == nb_font) {
    /* the char is not valid in all encodings ->
     * draw it using the first font :-(
     */
    fnum = first;
    ucs2fontmap(glyph, '?', encodings[fnum]);
  }

  (*buf).byte1 = glyph[0];
  (*buf).byte2 = glyph[1];

  x += XTextWidth16(fonts[fnum], buf, 1);

  return x;
}